

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

bool testing::internal::UnitTestOptions::MatchesFilter(string *name,char *filter)

{
  char *str;
  bool bVar1;
  char *pcVar2;
  
  str = (name->_M_dataplus)._M_p;
  do {
    bVar1 = PatternMatchesString(filter,str);
    if (bVar1) {
      return bVar1;
    }
    pcVar2 = strchr(filter,0x3a);
    filter = pcVar2 + 1;
  } while (pcVar2 != (char *)0x0);
  return bVar1;
}

Assistant:

bool UnitTestOptions::MatchesFilter(
    const std::string& name, const char* filter) {
  const char *cur_pattern = filter;
  for (;;) {
    if (PatternMatchesString(cur_pattern, name.c_str())) {
      return true;
    }

    // Finds the next pattern in the filter.
    cur_pattern = strchr(cur_pattern, ':');

    // Returns if no more pattern can be found.
    if (cur_pattern == NULL) {
      return false;
    }

    // Skips the pattern separater (the ':' character).
    cur_pattern++;
  }
}